

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

void stumpless_destroy_entry_and_contents(stumpless_entry *entry)

{
  ulong uVar1;
  
  if (entry != (stumpless_entry *)0x0) {
    if (entry->element_count != 0) {
      uVar1 = 0;
      do {
        stumpless_destroy_element_and_contents(entry->elements[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < entry->element_count);
    }
    unchecked_unload_entry(entry);
    cache_free(entry_cache,entry);
    return;
  }
  return;
}

Assistant:

void
stumpless_destroy_entry_and_contents( const struct stumpless_entry *entry ) {
  size_t i;

  if( !entry ) {
    return;
  }

  for( i = 0; i < entry->element_count; i++ ) {
    stumpless_destroy_element_and_contents( entry->elements[i] );
  }

  unchecked_destroy_entry( entry );
}